

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vfp_helper.c
# Opt level: O0

float32 helper_rints_aarch64(float32 x,void *fp_status)

{
  uint uVar1;
  float32 fVar2;
  float32 ret;
  int new_flags;
  int old_flags;
  void *fp_status_local;
  float32 x_local;
  
  uVar1 = get_float_exception_flags((float_status *)fp_status);
  fVar2 = float32_round_to_int_aarch64(x,(float_status *)fp_status);
  if ((uVar1 & 0x20) == 0) {
    uVar1 = get_float_exception_flags((float_status *)fp_status);
    set_float_exception_flags(uVar1 & 0xffffffdf,(float_status *)fp_status);
  }
  return fVar2;
}

Assistant:

float32 HELPER(rints)(float32 x, void *fp_status)
{
    int old_flags = get_float_exception_flags(fp_status), new_flags;
    float32 ret;

    ret = float32_round_to_int(x, fp_status);

    /* Suppress any inexact exceptions the conversion produced */
    if (!(old_flags & float_flag_inexact)) {
        new_flags = get_float_exception_flags(fp_status);
        set_float_exception_flags(new_flags & ~float_flag_inexact, fp_status);
    }

    return ret;
}